

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdSummary.cpp
# Opt level: O0

string * renderHolidays(string *__return_storage_ptr__,
                       map<Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Datetime>,_std::allocator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *holidays)

{
  map<Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Datetime>,_std::allocator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  bool bVar1;
  reference this_00;
  ostream *poVar2;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  reference local_1c0;
  pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *entry;
  const_iterator __end1;
  const_iterator __begin1;
  map<Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Datetime>,_std::allocator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  stringstream out;
  ostream local_190 [376];
  map<Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Datetime>,_std::allocator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_18;
  map<Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Datetime>,_std::allocator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *holidays_local;
  
  local_18 = holidays;
  holidays_local =
       (map<Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Datetime>,_std::allocator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  this = local_18;
  __end1 = std::
           map<Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Datetime>,_std::allocator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(local_18);
  entry = (pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             map<Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Datetime>,_std::allocator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(this);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&entry);
    if (!bVar1) break;
    this_00 = std::
              _Rb_tree_const_iterator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator*(&__end1);
    local_1c0 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"Y-M-D",&local_201);
    Datetime::toString(&local_1e0,&this_00->first,&local_200);
    poVar2 = std::operator<<(local_190,(string *)&local_1e0);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)&local_1c0->second);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::
    _Rb_tree_const_iterator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string renderHolidays (const std::map <Datetime, std::string>& holidays)
{
  std::stringstream out;

  for (auto& entry : holidays)
  {
    out << entry.first.toString ("Y-M-D")
        << " "
        << entry.second
        << '\n';
  }

  return out.str ();
}